

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi.cpp
# Opt level: O0

int opn2_describeChannels(OPN2_MIDIPlayer *device,char *str,char *attr,size_t size)

{
  MidiPlayer *play;
  size_t size_local;
  char *attr_local;
  char *str_local;
  OPN2_MIDIPlayer *device_local;
  
  if (device == (OPN2_MIDIPlayer *)0x0) {
    device_local._4_4_ = -1;
  }
  else {
    if ((OPNMIDIplay *)device->opn2_midiPlayer == (OPNMIDIplay *)0x0) {
      __assert_fail("play",
                    "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/thirdparty/libOPNMIDI/src/opnmidi.cpp"
                    ,0x332,
                    "int opn2_describeChannels(struct OPN2_MIDIPlayer *, char *, char *, size_t)");
    }
    OPNMIDIplay::describeChannels((OPNMIDIplay *)device->opn2_midiPlayer,str,attr,size);
    device_local._4_4_ = 0;
  }
  return device_local._4_4_;
}

Assistant:

OPNMIDI_EXPORT int opn2_describeChannels(struct OPN2_MIDIPlayer *device, char *str, char *attr, size_t size)
{
    if(!device)
        return -1;
    MidiPlayer *play = GET_MIDI_PLAYER(device);
    assert(play);
    play->describeChannels(str, attr, size);
    return 0;
}